

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_replace(anm_archive_t *anm,FILE *anmfp,anm_entry_t *entry_first,char *filename,int version)

{
  ushort uVar1;
  ushort uVar2;
  list_node_t *plVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  uchar *__ptr;
  format_t local_e8;
  undefined4 local_e4;
  uint32_t local_d8;
  uint32_t local_d4;
  size_t local_d0;
  size_t size;
  image_t image2;
  uint32_t oy_1;
  uint32_t ox_1;
  uchar *converted_data;
  format_t fmt;
  uint y;
  list_node_t *node;
  anm_entry_t *entry_next;
  anm_entry_t *entry_1;
  long offset;
  uint32_t oy;
  uint32_t ox;
  anm_entry_t *entry;
  image_t *piStack_60;
  int is_png;
  image_t *image;
  uint local_50;
  uint height;
  uint width;
  uint f;
  format_t formats [5];
  int version_local;
  char *filename_local;
  anm_entry_t *entry_first_local;
  FILE *anmfp_local;
  anm_archive_t *anm_local;
  
  _width = 0x1ffffffff;
  formats[0] = FORMAT_RGB565;
  formats[1] = FORMAT_ARGB4444;
  formats[2] = FORMAT_GRAY8;
  local_50 = 0;
  image._4_4_ = 0;
  formats[3] = version;
  unique0x100007ed = filename;
  util_total_entry_size(entry_first,&local_50,(uint *)((long)&image + 4));
  if ((local_50 != 0) && (image._4_4_ != 0)) {
    bVar4 = false;
    if (formats[3] == 0x13) {
      if (option_dont_add_offset_border == 0) {
        local_d4 = entry_first->header->x;
        local_d8 = entry_first->header->y;
      }
      else {
        local_d4 = 0;
        local_d8 = 0;
      }
      iVar6 = png_identify(entry_first->data,entry_first->thtx->size);
      if ((iVar6 == 0) ||
         (((local_d4 == 0 && (local_d8 == 0)) && (entry_first->next_by_name == (anm_entry_t *)0x0)))
         ) {
        if (1 < option_verbose) {
          fprintf(_stderr,"%s: not composing %s\n",argv0,stack0xffffffffffffffd0);
        }
        if ((local_d4 == 0) && (local_d8 == 0)) {
          if (entry_first->next_by_name == (anm_entry_t *)0x0) {
            return;
          }
          if (((entry_first->next_by_name->next_by_name == (anm_entry_t *)0x0) &&
              (entry_first->thtx->size == entry_first->next_by_name->thtx->size)) &&
             (iVar6 = memcmp(entry_first->data,entry_first->next_by_name->data,
                             (ulong)entry_first->thtx->size), iVar6 == 0)) {
            return;
          }
        }
        fprintf(_stderr,"%s: warning: %s can\'t be composed because it\'s a JPEG\n",argv0,
                stack0xffffffffffffffd0);
        return;
      }
      if (1 < option_verbose) {
        fprintf(_stderr,"%s: composing %s\n",argv0,stack0xffffffffffffffd0);
      }
      piStack_60 = (image_t *)malloc(0x18);
      png_read_mem(piStack_60,entry_first->data,(ulong)entry_first->thtx->size);
      bVar4 = true;
    }
    else {
      piStack_60 = png_read(stack0xffffffffffffffd0);
    }
    if ((piStack_60->width < local_50) || (piStack_60->height < image._4_4_)) {
      fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
              current_input,entry_first->name,stack0xffffffffffffffd0,piStack_60->width,
              piStack_60->height,local_50,image._4_4_);
      exit(1);
    }
    for (height = 0; height < 5; height = height + 1) {
      entry_1 = (anm_entry_t *)0x0;
      node = (list_node_t *)entry_first;
      for (_fmt = (anm->entries).head; _fmt != (list_node_t *)0x0; _fmt = _fmt->next) {
        plVar3 = (list_node_t *)_fmt->data;
        if (((plVar3 == node) &&
            ((uint)*(ushort *)((long)&plVar3->prev->next + 6) == (&width)[height])) &&
           (*(short *)((long)&plVar3->next[2].next + 4) != 0)) {
          converted_data._0_4_ = (&width)[height];
          if (bVar4) {
            if ((format_t)converted_data != FORMAT_BGRA8888) {
              fprintf(_stderr,"%s: %s is not FORMAT_BGRA8888\n",argv0,plVar3->data);
              exit(1);
            }
            converted_data._0_4_ = 0xffffffff;
            *(uint *)((long)&plVar3->prev->prev + 4) =
                 (uint)*(ushort *)&plVar3->prev->prev *
                 (uint)*(ushort *)((long)&plVar3->prev->prev + 2) * 4;
            free(plVar3[3].data);
            pvVar12 = malloc((ulong)*(uint *)((long)&plVar3->prev->prev + 4));
            plVar3[3].data = pvVar12;
          }
          __ptr = format_from_rgba((uint32_t *)piStack_60->data,local_50 * image._4_4_,
                                   (format_t)converted_data);
          if (option_dont_add_offset_border == 0) {
            local_e4 = *(undefined4 *)&plVar3->next[1].prev;
          }
          else {
            local_e4 = 0;
          }
          image2._20_4_ = local_e4;
          if (option_dont_add_offset_border == 0) {
            local_e8 = *(format_t *)((long)&plVar3->next[1].prev + 4);
          }
          else {
            local_e8 = 0;
          }
          image2.format = local_e8;
          if (anmfp == (FILE *)0x0) {
            for (converted_data._4_4_ = local_e8;
                converted_data._4_4_ < image2.format + *(ushort *)((long)&plVar3->prev->prev + 2);
                converted_data._4_4_ = converted_data._4_4_ + FORMAT_BGRA8888) {
              pvVar12 = plVar3[3].data;
              iVar6 = converted_data._4_4_ - image2.format;
              uVar1 = *(ushort *)&plVar3->prev->prev;
              uVar8 = format_Bpp((format_t)converted_data);
              iVar10 = converted_data._4_4_ * local_50;
              uVar7 = format_Bpp((format_t)converted_data);
              uVar5 = image2._20_4_;
              uVar9 = format_Bpp((format_t)converted_data);
              uVar2 = *(ushort *)&plVar3->prev->prev;
              uVar11 = format_Bpp((format_t)converted_data);
              memcpy((void *)((long)pvVar12 + (ulong)(iVar6 * (uint)uVar1 * uVar8)),
                     __ptr + (ulong)(uVar5 * uVar9) + (ulong)(iVar10 * uVar7),
                     (ulong)(uVar2 * uVar11));
            }
          }
          else {
            for (converted_data._4_4_ = local_e8;
                converted_data._4_4_ < image2.format + *(ushort *)((long)&plVar3->prev->prev + 2);
                converted_data._4_4_ = converted_data._4_4_ + FORMAT_BGRA8888) {
              uVar8 = *(uint *)&plVar3->next[2].next;
              iVar6 = converted_data._4_4_ - image2.format;
              uVar1 = *(ushort *)&plVar3->prev->prev;
              uVar7 = format_Bpp((format_t)converted_data);
              iVar6 = file_seek(anmfp,(long)&entry_1->name +
                                      (ulong)(iVar6 * (uint)uVar1 * uVar7) + (ulong)uVar8);
              if (iVar6 == 0) {
                exit(1);
              }
              iVar6 = converted_data._4_4_ * local_50;
              uVar8 = format_Bpp((format_t)converted_data);
              uVar5 = image2._20_4_;
              uVar7 = format_Bpp((format_t)converted_data);
              uVar1 = *(ushort *)&plVar3->prev->prev;
              uVar9 = format_Bpp((format_t)converted_data);
              iVar6 = file_write(anmfp,__ptr + (ulong)(uVar5 * uVar7) + (ulong)(iVar6 * uVar8),
                                 (ulong)(uVar1 * uVar9));
              if (iVar6 == 0) {
                exit(1);
              }
            }
          }
          free(__ptr);
          if (bVar4) {
            size = (size_t)plVar3[3].data;
            image2.data._0_4_ = (uint)*(ushort *)&plVar3->prev->prev;
            image2.data._4_4_ = (uint)*(ushort *)((long)&plVar3->prev->prev + 2);
            image2.width = 0xffffffff;
            pvVar12 = png_write_mem((image_t *)&size,&local_d0);
            plVar3[3].data = pvVar12;
            *(int *)((long)&plVar3->prev->prev + 4) = (int)local_d0;
            free((void *)size);
          }
          *(undefined4 *)&plVar3[2].next = 1;
        }
        if (plVar3 == node) {
          node = (list_node_t *)plVar3[1].data;
        }
        entry_1 = (anm_entry_t *)((long)&entry_1->header + (ulong)*(uint *)&plVar3->next[2].prev);
      }
    }
    free(piStack_60->data);
    free(piStack_60);
  }
  return;
}

Assistant:

static void
anm_replace(
    anm_archive_t* anm,
    FILE* anmfp,
    anm_entry_t* entry_first,
    const char* filename,
    int version)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(entry_first, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    int is_png = 0;
    /* NEWHU: 19 */
    if (version == 19) {
        anm_entry_t *entry = entry_first;
        const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
        const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
        if (!(png_identify(entry->data, entry->thtx->size) && (ox || oy || entry->next_by_name))) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->data, entry->next_by_name->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            return;
        }
        if (option_verbose >= 2)
            fprintf(stderr, "%s: composing %s\n", argv0, filename);
        image = malloc(sizeof(image_t));
        png_read_mem(image, entry->data, entry->thtx->size);
        is_png = 1;
    } else {
        image = png_read(filename);
    }

    if (width > image->width || height > image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, entry_first->name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        long offset = 0;
        anm_entry_t *entry, *entry_next = entry_first;
        list_for_each(&anm->entries, entry) {
            if (entry == entry_next &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;
                format_t fmt = formats[f];

                if (is_png) {
                    if (fmt != FORMAT_BGRA8888) {
                        fprintf(stderr, "%s: %s is not FORMAT_BGRA8888\n", argv0, entry->name);
                        exit(1);
                    }
                    fmt = FORMAT_RGBA8888;
                    entry->thtx->size = entry->thtx->w*entry->thtx->h*4;
                    free(entry->data);
                    entry->data = malloc(entry->thtx->size);
                }

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, fmt);
                const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
                const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;

                if (anmfp) {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - oy) * entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt), entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                    }
                } else {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - oy) * entry->thtx->w * format_Bpp(fmt),
                               converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt),
                               entry->thtx->w * format_Bpp(fmt));
                    }
                }

                free(converted_data);

                if (is_png) {
                    image_t image2 = {
                        .data = entry->data,
                        .width = entry->thtx->w,
                        .height = entry->thtx->h,
                        .format = FORMAT_RGBA8888,
                    };
                    size_t size;
                    entry->data = png_write_mem(&image2, &size);
                    entry->thtx->size = size;
                    free(image2.data);
                }

                entry->processed = 1;
            }
            if (entry == entry_next)
                entry_next = entry->next_by_name;

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}